

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endec_pair_tester.hxx
# Opt level: O2

void __thiscall
cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_seed_ofb>>::
check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (endec_pair_tester<cryptox::symmetric_algorithm<&EVP_seed_ofb>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source)

{
  size_t local_140;
  buffer_type plaintext;
  buffer_type ciphertext;
  assertion_result local_f8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  basic_endec<cryptox::symmetric_algorithm<&EVP_seed_ofb>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
  ::operator()((basic_endec<cryptox::symmetric_algorithm<&EVP_seed_ofb>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
                *)(this + 0x48),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish,&ciphertext);
  plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  basic_endec<cryptox::symmetric_algorithm<&EVP_seed_ofb>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  ::operator()((basic_endec<cryptox::symmetric_algorithm<&EVP_seed_ofb>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                *)(this + 0x68),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&plaintext);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x35);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_002b7238;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_b8 = "";
  local_f8._0_8_ =
       (long)ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_140 = symmetric_algorithm<&EVP_seed_ofb>::ciphertext_size_for
                        ((long)(source->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(source->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_e0,&local_c0,0x35,1,2,&local_f8,"ciphertext.size()",&local_140,
             "Algorithm::ciphertext_size_for(source.size())");
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x37);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_002b7238;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_78 = "";
  local_f8._0_8_ =
       (long)plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_140 = (long)(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_e0,&local_80,0x37,1,2,&local_f8,"plaintext.size()",&local_140,"source.size()");
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x3c);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_f8,(equal_coll_impl *)&local_140,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_002b7238;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_e0,&local_b0,0x3c,1,0xd,4,"source.begin()","source.end()",
             "plaintext.begin()","plaintext.end()");
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void check_roundtrip(const Container& source) {
			buffer_type ciphertext;
			encryptor(source.begin(), source.end(),
			          std::back_inserter(ciphertext));

			buffer_type plaintext;
			decryptor(ciphertext.begin(), ciphertext.end(),
			          std::back_inserter(plaintext));

			BOOST_CHECK_EQUAL(
				ciphertext.size(),
				Algorithm::ciphertext_size_for(source.size())
			);

			BOOST_CHECK_EQUAL(plaintext.size(), source.size());

			BOOST_CHECK_EQUAL_COLLECTIONS(
				source.begin(), source.end(),
				plaintext.begin(), plaintext.end()
			);
		}